

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O1

void __thiscall InputGraph::InputGraph(InputGraph *this,int size,bool v,bool e)

{
  _Base_ptr p_Var1;
  unordered_map_adaptor<_d10c590c_> uVar2;
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var3;
  pointer *__ptr;
  undefined1 auVar4 [16];
  allocator_type local_41;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  map<std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  _Var3._M_head_impl = (Imp *)operator_new(0x100);
  (_Var3._M_head_impl)->size = 0;
  (_Var3._M_head_impl)->has_vertex_labels = false;
  (_Var3._M_head_impl)->has_edge_labels = false;
  local_38 = &(_Var3._M_head_impl)->edges;
  p_Var1 = (_Base_ptr)((long)&(_Var3._M_head_impl)->edges + 8);
  auVar4 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])&((_Var3._M_head_impl)->edges)._M_t = ZEXT1632(auVar4);
  *(undefined1 (*) [32])((long)&(_Var3._M_head_impl)->edges + 0x10) = ZEXT1632(auVar4);
  *(_Base_ptr *)((long)&(_Var3._M_head_impl)->edges + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(_Var3._M_head_impl)->edges + 0x20) = p_Var1;
  local_40 = &(_Var3._M_head_impl)->vertex_labels;
  *(undefined1 (*) [32])((long)&(_Var3._M_head_impl)->edges + 0x28) = ZEXT1632(auVar4);
  uVar2.super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.super_type.dwfb.data =
       (unordered_associative_container_adaptor<_ddf44b9e_>)
       ((long)&(_Var3._M_head_impl)->vertex_names + 0x20);
  *(unordered_associative_container_adaptor<_ddf44b9e_> *)
   ((long)&(_Var3._M_head_impl)->vertex_names + 8) =
       uVar2.super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.super_type.dwfb.
       data;
  boost::multi_index::
  multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
  ::multi_index_container
            ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
              *)((long)&(_Var3._M_head_impl)->vertex_names + 0x10),&local_41);
  ((left_map *)((long)&(_Var3._M_head_impl)->vertex_names + 0x98))->
  super_unordered_map_adaptor<_d10c590c_> =
       (unordered_map_adaptor<_d10c590c_>)
       uVar2.super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.super_type.dwfb.
       data;
  ((right_map *)((long)&(_Var3._M_head_impl)->vertex_names + 0xa0))->
  super_unordered_map_adaptor<_889104df_> =
       (unordered_map_adaptor<_889104df_>)
       uVar2.super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.super_type.dwfb.
       data;
  (_Var3._M_head_impl)->loopy = false;
  (_Var3._M_head_impl)->directed = false;
  (this->_imp)._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
  _M_t.super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
  super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl = _Var3._M_head_impl;
  (_Var3._M_head_impl)->has_vertex_labels = v;
  (_Var3._M_head_impl)->has_edge_labels = e;
  (_Var3._M_head_impl)->loopy = false;
  (_Var3._M_head_impl)->directed = false;
  if (size != 0) {
    (_Var3._M_head_impl)->size = size;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(local_40,(long)size);
  }
  return;
}

Assistant:

InputGraph::InputGraph(int size, bool v, bool e) :
    _imp(new Imp{})
{
    _imp->has_vertex_labels = v;
    _imp->has_edge_labels = e;
    _imp->loopy = false;
    _imp->directed = false;

    if (0 != size)
        resize(size);
}